

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialMotionVector.cpp
# Opt level: O2

double __thiscall iDynTree::SpatialMotionVector::exp(SpatialMotionVector *this,double __x)

{
  long in_RSI;
  double __x_00;
  double extraout_XMM0_Qa;
  Position newPos;
  Matrix3x3 J_SO3;
  Position *local_e0 [2];
  Position local_d0;
  Rotation local_b8;
  Matrix3x3 local_70;
  
  Transform::Transform((Transform *)this);
  Position::Position(&local_d0);
  Rotation::leftJacobian(&local_70,(AngularMotionVector3 *)(in_RSI + 0x18));
  local_e0[0] = &local_d0;
  local_b8.super_Matrix3x3.m_data[0] = (double)&local_70;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>,Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_e0,
             (Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              *)&local_b8);
  Transform::setPosition((Transform *)this,&local_d0);
  GeomVector3::exp((GeomVector3 *)&local_b8,__x_00);
  Transform::setRotation((Transform *)this,&local_b8);
  return extraout_XMM0_Qa;
}

Assistant:

Transform SpatialMotionVector::exp() const
{
    Transform res;

    // the linear part is affected by the left Jacobian of SO(3)
    Position newPos;
    auto J_SO3 = Rotation::leftJacobian(this->getAngularVec3());
    toEigen(newPos) = toEigen(J_SO3)*toEigen(this->getLinearVec3());
    res.setPosition(newPos);

    // the angular part instead mapped by so(3) -> SO(3) exp map
    res.setRotation(this->getAngularVec3().exp());

    return res;
}